

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O3

size_t __thiscall
Memory::check_memory_internal
          (Memory *this,PatternAddressMapper *mapping,char *start,char *end,
          bool reproducibility_mode,bool verbose)

{
  pointer *ppBVar1;
  size_t *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *__s1;
  byte *flipped_address;
  byte actual_value;
  byte expected_value;
  iterator iVar4;
  uint uVar5;
  int iVar6;
  void *__s2;
  byte *pbVar7;
  unsigned_long timestamp;
  size_t sVar8;
  long lVar9;
  size_t __size;
  int *piVar10;
  pointer pvVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 local_118 [8];
  int expected_rand_value;
  size_t local_100;
  int *local_f8;
  Memory *local_f0;
  vector<BitFlip,std::allocator<BitFlip>> *local_e8;
  ulong local_e0;
  ulong local_d8;
  PatternAddressMapper *local_d0;
  ulong local_c8;
  undefined1 local_c0 [8];
  DRAMAddr flipped_addr_dram;
  string local_78;
  undefined1 auStack_58 [8];
  BitFlip bitflip;
  
  local_d0 = mapping;
  if (start == (char *)0x0 || end <= start) {
    psVar2 = &bitflip.address.row;
    auStack_58 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_58,"Function check_memory called with invalid arguments.","");
    Logger::log_error((string *)auStack_58,true);
    if (auStack_58 != (undefined1  [8])psVar2) {
      operator_delete((void *)auStack_58,bitflip.address.row + 1);
    }
    paVar3 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Start addr.: %s","");
    DRAMAddr::DRAMAddr((DRAMAddr *)local_118,start);
    DRAMAddr::to_string_abi_cxx11_((string *)local_c0,(DRAMAddr *)local_118);
    format_string<char_const*>((string *)auStack_58,&local_78,(char *)local_c0);
    Logger::log_data((string *)auStack_58,true);
    if (auStack_58 != (undefined1  [8])psVar2) {
      operator_delete((void *)auStack_58,bitflip.address.row + 1);
    }
    if (local_c0 != (undefined1  [8])&flipped_addr_dram.row) {
      operator_delete((void *)local_c0,flipped_addr_dram.row + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    local_78._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"End addr.: %s","");
    DRAMAddr::DRAMAddr((DRAMAddr *)local_118,end);
    DRAMAddr::to_string_abi_cxx11_((string *)local_c0,(DRAMAddr *)local_118);
    format_string<char_const*>((string *)auStack_58,&local_78,(char *)local_c0);
    Logger::log_data((string *)auStack_58,true);
    if (auStack_58 != (undefined1  [8])psVar2) {
      operator_delete((void *)auStack_58,bitflip.address.row + 1);
    }
    if (local_c0 != (undefined1  [8])&flipped_addr_dram.row) {
      operator_delete((void *)local_c0,flipped_addr_dram.row + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    sVar12 = 0;
  }
  else {
    uVar14 = (long)start - (long)this->start_address;
    uVar5 = getpagesize();
    __size = (size_t)(int)uVar5;
    uVar14 = uVar14 - uVar14 % __size;
    __s2 = calloc(1,__size);
    if (__s2 == (void *)0x0) {
      auStack_58 = (undefined1  [8])&bitflip.address.row;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_58,"Could not create temporary page for memory comparison.","");
      Logger::log_error((string *)auStack_58,true);
      std::__cxx11::string::~string((string *)auStack_58);
      exit(1);
    }
    uVar13 = (long)(end + (uVar14 - (long)start)) - (ulong)(end + (uVar14 - (long)start)) % __size;
    if (uVar14 < uVar13) {
      local_e8 = (vector<BitFlip,std::allocator<BitFlip>> *)&this->flipped_bits;
      sVar12 = 0;
      local_f0 = this;
      local_d8 = uVar13;
      do {
        local_c8 = uVar14;
        srand(uVar5 * (int)uVar14);
        if (3 < uVar5) {
          lVar9 = 0;
          do {
            iVar6 = rand();
            *(int *)((long)__s2 + lVar9 * 4) = iVar6;
            lVar9 = lVar9 + 1;
          } while ((__size >> 2) + (ulong)(__size >> 2 == 0) != lVar9);
        }
        uVar14 = local_c8;
        __s1 = this->start_address + local_c8;
        if ((this->start_address + this->size <= __s1 + __size) ||
           (iVar6 = bcmp(__s1,__s2,__size), iVar6 != 0)) {
          uVar13 = 0;
          do {
            piVar10 = (int *)(this->start_address + uVar14 + uVar13);
            if (piVar10 < this->start_address + this->size) {
              clflushopt((char)*piVar10);
              iVar6 = *(int *)((long)__s2 + uVar13);
              local_118._0_4_ = iVar6;
              if (*piVar10 != iVar6) {
                lVar9 = 0;
                local_f8 = piVar10;
                local_e0 = uVar13;
                do {
                  actual_value = local_118[lVar9];
                  if (*(byte *)((long)piVar10 + lVar9) != actual_value) {
                    flipped_address = (byte *)((long)piVar10 + lVar9);
                    local_100 = sVar12;
                    DRAMAddr::DRAMAddr((DRAMAddr *)local_c0,flipped_address);
                    pbVar7 = (byte *)DRAMAddr::to_virt((DRAMAddr *)local_c0);
                    sVar12 = flipped_addr_dram.bank;
                    if (flipped_address != pbVar7) {
                      __assert_fail("flipped_address == (volatile char*)flipped_addr_dram.to_virt()"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/src/Memory/Memory.cpp"
                                    ,0xa7,
                                    "size_t Memory::check_memory_internal(PatternAddressMapper &, const volatile char *, const volatile char *, bool, bool)"
                                   );
                    }
                    expected_value = *flipped_address;
                    if (verbose) {
                      timestamp = time((time_t *)0x0);
                      Logger::log_bitflip((char *)flipped_address,sVar12,actual_value,expected_value
                                          ,timestamp,true);
                    }
                    BitFlip::BitFlip((BitFlip *)auStack_58,(DRAMAddr *)local_c0,
                                     actual_value ^ expected_value,expected_value);
                    this = local_f0;
                    sVar12 = local_100;
                    if (!reproducibility_mode) {
                      pvVar11 = (local_d0->bit_flips).
                                super__Vector_base<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      if ((local_d0->bit_flips).
                          super__Vector_base<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == pvVar11) {
                        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_78,
                                   "Cannot store bit flips found in given address mapping.\nYou need to create an empty vector in PatternAddressMapper::bit_flips before calling check_memory."
                                   ,"");
                        Logger::log_error(&local_78,true);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_78._M_dataplus._M_p != &local_78.field_2) {
                          operator_delete(local_78._M_dataplus._M_p,
                                          local_78.field_2._M_allocated_capacity + 1);
                        }
                        pvVar11 = (local_d0->bit_flips).
                                  super__Vector_base<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                      }
                      iVar4._M_current =
                           pvVar11[-1].super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                      if (iVar4._M_current ==
                          pvVar11[-1].super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<BitFlip,std::allocator<BitFlip>>::
                        _M_realloc_insert<BitFlip_const&>
                                  ((vector<BitFlip,std::allocator<BitFlip>> *)(pvVar11 + -1),iVar4,
                                   (BitFlip *)auStack_58);
                      }
                      else {
                        (iVar4._M_current)->observation_time = bitflip._24_8_;
                        ((iVar4._M_current)->address).col = bitflip.address.row;
                        (iVar4._M_current)->bitmask = (undefined1)bitflip.address.col;
                        (iVar4._M_current)->corrupted_data = bitflip.address.col._1_1_;
                        *(undefined6 *)&(iVar4._M_current)->field_0x1a = bitflip.address.col._2_6_;
                        ((iVar4._M_current)->address).bank = (size_t)auStack_58;
                        ((iVar4._M_current)->address).row = bitflip.address.bank;
                        ppBVar1 = &pvVar11[-1].super__Vector_base<BitFlip,_std::allocator<BitFlip>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *ppBVar1 = *ppBVar1 + 1;
                      }
                    }
                    iVar4._M_current =
                         (this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar4._M_current ==
                        (this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<BitFlip,std::allocator<BitFlip>>::
                      _M_realloc_insert<BitFlip_const&>(local_e8,iVar4,(BitFlip *)auStack_58);
                    }
                    else {
                      (iVar4._M_current)->observation_time = bitflip._24_8_;
                      ((iVar4._M_current)->address).col = bitflip.address.row;
                      (iVar4._M_current)->bitmask = (undefined1)bitflip.address.col;
                      (iVar4._M_current)->corrupted_data = bitflip.address.col._1_1_;
                      *(undefined6 *)&(iVar4._M_current)->field_0x1a = bitflip.address.col._2_6_;
                      ((iVar4._M_current)->address).bank = (size_t)auStack_58;
                      ((iVar4._M_current)->address).row = bitflip.address.bank;
                      ppBVar1 = &(this->flipped_bits).
                                 super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
                                 super__Vector_impl_data._M_finish;
                      *ppBVar1 = *ppBVar1 + 1;
                    }
                    sVar8 = BitFlip::count_bit_corruptions((BitFlip *)auStack_58);
                    sVar12 = sVar12 + sVar8;
                    piVar10 = local_f8;
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 4);
                *piVar10 = iVar6;
                clflushopt((char)*piVar10);
                uVar13 = local_e0;
                uVar14 = local_c8;
              }
            }
            uVar13 = uVar13 + 4;
          } while (uVar13 < __size);
        }
        uVar14 = uVar14 + __size;
      } while (uVar14 < local_d8);
    }
    else {
      sVar12 = 0;
    }
    free(__s2);
  }
  return sVar12;
}

Assistant:

size_t Memory::check_memory_internal(PatternAddressMapper &mapping,
                                     const volatile char *start,
                                     const volatile char *end,
                                     bool reproducibility_mode,
                                     bool verbose) {
  // counter for the number of found bit flips in the memory region [start, end]
  size_t found_bitflips = 0;

  if (start==nullptr || end==nullptr || ((uint64_t) start >= (uint64_t) end)) {
    Logger::log_error("Function check_memory called with invalid arguments.");
    Logger::log_data(format_string("Start addr.: %s", DRAMAddr((void *) start).to_string().c_str()));
    Logger::log_data(format_string("End addr.: %s", DRAMAddr((void *) end).to_string().c_str()));
    return found_bitflips;
  }

  auto start_offset = (uint64_t) (start - start_address);

  const auto pagesize = static_cast<size_t>(getpagesize());
  start_offset = (start_offset/pagesize)*pagesize;

  auto end_offset = start_offset + (uint64_t) (end - start);
  end_offset = (end_offset/pagesize)*pagesize;

  void *page_raw = malloc(pagesize);
  if (page_raw == nullptr) {
    Logger::log_error("Could not create temporary page for memory comparison.");
    exit(EXIT_FAILURE);
  }
  memset(page_raw, 0, pagesize);
  int *page = (int*)page_raw;

  // for each page (4K) in the address space [start, end]
  for (uint64_t i = start_offset; i < end_offset; i += pagesize) {
    // reseed rand to have the desired sequence of reproducible numbers
    srand(static_cast<unsigned int>(i*pagesize));

    // fill comparison page with expected values generated by rand()
    for (size_t j = 0; j < (unsigned long) pagesize/sizeof(int); ++j)
      page[j] = rand();

    uint64_t addr = ((uint64_t)start_address+i);

    // check if any bit flipped in the page using the fast memcmp function, if any flip occurred we need to iterate over
    // each byte one-by-one (much slower), otherwise we just continue with the next page
    if ((addr+ pagesize) < ((uint64_t)start_address+size) && memcmp((void*)addr, (void*)page, pagesize) == 0)
      continue;

    // iterate over blocks of 4 bytes (=sizeof(int))
    for (uint64_t j = 0; j < (uint64_t) pagesize; j += sizeof(int)) {
      uint64_t offset = i + j;
      volatile char *cur_addr = start_address + offset;

      // if this address is outside the superpage we must not proceed to avoid segfault
      if ((uint64_t)cur_addr >= ((uint64_t)start_address+size))
        continue;

      // clear the cache to make sure we do not access a cached value
      clflushopt(cur_addr);
      mfence();

      // if the bit did not flip -> continue checking next block
      int expected_rand_value = page[j/sizeof(int)];
      if (*((int *) cur_addr)==expected_rand_value)
        continue;

      // if the bit flipped -> compare byte per byte
      for (unsigned long c = 0; c < sizeof(int); c++) {
        volatile char *flipped_address = cur_addr + c;
        if (*flipped_address != ((char *) &expected_rand_value)[c]) {
          const auto flipped_addr_dram = DRAMAddr((void *) flipped_address);
          assert(flipped_address == (volatile char*)flipped_addr_dram.to_virt());
          const auto flipped_addr_value = *(unsigned char *) flipped_address;
          const auto expected_value = ((unsigned char *) &expected_rand_value)[c];
          if (verbose) {
            Logger::log_bitflip(flipped_address, flipped_addr_dram.row,
                expected_value, flipped_addr_value, (size_t) time(nullptr), true);
          }
          // store detailed information about the bit flip
          BitFlip bitflip(flipped_addr_dram, (expected_value ^ flipped_addr_value), flipped_addr_value);
          // ..in the mapping that triggered this bit flip
          if (!reproducibility_mode) {
            if (mapping.bit_flips.empty()) {
              Logger::log_error("Cannot store bit flips found in given address mapping.\n"
                                "You need to create an empty vector in PatternAddressMapper::bit_flips before calling "
                                "check_memory.");
            }
            mapping.bit_flips.back().push_back(bitflip);
          }
          // ..in an attribute of this class so that it can be retrived by the caller
          flipped_bits.push_back(bitflip);
          found_bitflips += bitflip.count_bit_corruptions();
        }
      }

      // restore original (unflipped) value
      *((int *) cur_addr) = expected_rand_value;

      // flush this address so that value is committed before hammering again there
      clflushopt(cur_addr);
      mfence();
    }
  }
  
  free(page);
  return found_bitflips;
}